

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::
initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper::
~initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper
          (initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper
           *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)this);
  operator_delete(this,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, InvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageException) {

  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  SessionID sessionID( BeginString( "FIXT.1.1" ), SenderCompID( "TW" ), TargetCompID( "ISLD" ) );

  TimeRange sessionTime( startTime, endTime, 0, 31);

  DataDictionaryProvider provider;
  provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIXT11.xml" );
  DataDictionary dictionary = provider.getSessionDataDictionary(sessionID.getBeginString());

  std::shared_ptr<DataDictionary> pDataDictionary = std::make_shared<DataDictionary>(dictionary);

  provider.addTransportDataDictionary( sessionID.getBeginString(), pDataDictionary );
  provider.addApplicationDataDictionary(ApplVerID("20"), pDataDictionary);

  object = new Session( *this, factory, sessionID, provider,
      sessionTime, 1, 0 );
  object->setSenderDefaultApplVerID(ApplVerID("20"));
  object->setTargetDefaultApplVerID(ApplVerID("20"));


  FIX42::NewOrderSingle newOrderSingle;
  std::string newOrderSingleRawFIX;
  std::string delimSOH = "\x01";
  newOrderSingleRawFIX = "8=FIXT.4.2" + delimSOH
      + "35=A" + delimSOH
      + "9=114" + delimSOH
      + "34=2" + delimSOH
      + "49=ISLD" + delimSOH
      + "56=TW" + delimSOH
      + "52=20190517-16:08:43" + delimSOH
      + "98=0" + delimSOH
      + "108=1" + delimSOH
      + "10=166" + delimSOH;

  CHECK_THROW(object->next(newOrderSingleRawFIX, UtcTimeStamp()), InvalidMessage);
}